

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

CubeFaceIntCoords tcu::remapCubeEdgeCoords(CubeFaceIntCoords *origCoords,int size)

{
  CubeFaceIntCoords CVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int y_;
  int *piVar5;
  Vector<int,_2> local_bc;
  Vector<int,_2> local_b4;
  Vector<int,_2> local_ac;
  Vector<int,_2> local_a4;
  Vector<int,_2> local_9c;
  Vector<int,_2> local_94;
  Vector<int,_2> local_8c;
  Vector<int,_3> local_84;
  Vector<int,_3> local_78;
  Vector<int,_3> local_6c;
  Vector<int,_3> local_60;
  Vector<int,_3> local_54;
  Vector<int,_3> local_48;
  undefined1 local_3c [8];
  IVec3 canonizedCoords;
  IVec2 coords;
  bool vInBounds;
  bool uInBounds;
  int size_local;
  CubeFaceIntCoords *origCoords_local;
  undefined4 uStack_10;
  int local_c;
  
  bVar2 = de::inBounds<int>(origCoords->s,0,size);
  bVar3 = de::inBounds<int>(origCoords->t,0,size);
  if ((bVar2) && (bVar3)) {
    origCoords_local._4_4_ = origCoords->face;
    uStack_10 = origCoords->s;
    local_c = origCoords->t;
  }
  else if ((bVar2) || (bVar3)) {
    iVar4 = wrap(CLAMP_TO_BORDER,origCoords->s,size);
    y_ = wrap(CLAMP_TO_BORDER,origCoords->t,size);
    Vector<int,_2>::Vector((Vector<int,_2> *)(canonizedCoords.m_data + 1),iVar4,y_);
    Vector<int,_3>::Vector((Vector<int,_3> *)local_3c);
    switch(origCoords->face) {
    case CUBEFACE_NEGATIVE_X:
      piVar5 = Vector<int,_2>::y((Vector<int,_2> *)(canonizedCoords.m_data + 1));
      iVar4 = *piVar5;
      piVar5 = Vector<int,_2>::x((Vector<int,_2> *)(canonizedCoords.m_data + 1));
      Vector<int,_3>::Vector(&local_48,0,(size + -1) - iVar4,*piVar5);
      local_3c._0_4_ = local_48.m_data[0];
      local_3c._4_4_ = local_48.m_data[1];
      canonizedCoords.m_data[0] = local_48.m_data[2];
      break;
    case CUBEFACE_POSITIVE_X:
      piVar5 = Vector<int,_2>::y((Vector<int,_2> *)(canonizedCoords.m_data + 1));
      iVar4 = *piVar5;
      piVar5 = Vector<int,_2>::x((Vector<int,_2> *)(canonizedCoords.m_data + 1));
      Vector<int,_3>::Vector(&local_54,size + -1,(size + -1) - iVar4,(size + -1) - *piVar5);
      local_3c._0_4_ = local_54.m_data[0];
      local_3c._4_4_ = local_54.m_data[1];
      canonizedCoords.m_data[0] = local_54.m_data[2];
      break;
    case CUBEFACE_NEGATIVE_Y:
      piVar5 = Vector<int,_2>::x((Vector<int,_2> *)(canonizedCoords.m_data + 1));
      iVar4 = *piVar5;
      piVar5 = Vector<int,_2>::y((Vector<int,_2> *)(canonizedCoords.m_data + 1));
      Vector<int,_3>::Vector(&local_60,iVar4,0,(size + -1) - *piVar5);
      local_3c._0_4_ = local_60.m_data[0];
      local_3c._4_4_ = local_60.m_data[1];
      canonizedCoords.m_data[0] = local_60.m_data[2];
      break;
    case CUBEFACE_POSITIVE_Y:
      piVar5 = Vector<int,_2>::x((Vector<int,_2> *)(canonizedCoords.m_data + 1));
      iVar4 = *piVar5;
      piVar5 = Vector<int,_2>::y((Vector<int,_2> *)(canonizedCoords.m_data + 1));
      Vector<int,_3>::Vector(&local_6c,iVar4,size + -1,*piVar5);
      local_3c._0_4_ = local_6c.m_data[0];
      local_3c._4_4_ = local_6c.m_data[1];
      canonizedCoords.m_data[0] = local_6c.m_data[2];
      break;
    case CUBEFACE_NEGATIVE_Z:
      piVar5 = Vector<int,_2>::x((Vector<int,_2> *)(canonizedCoords.m_data + 1));
      iVar4 = *piVar5;
      piVar5 = Vector<int,_2>::y((Vector<int,_2> *)(canonizedCoords.m_data + 1));
      Vector<int,_3>::Vector(&local_78,(size + -1) - iVar4,(size + -1) - *piVar5,0);
      local_3c._0_4_ = local_78.m_data[0];
      local_3c._4_4_ = local_78.m_data[1];
      canonizedCoords.m_data[0] = local_78.m_data[2];
      break;
    case CUBEFACE_POSITIVE_Z:
      piVar5 = Vector<int,_2>::x((Vector<int,_2> *)(canonizedCoords.m_data + 1));
      iVar4 = *piVar5;
      piVar5 = Vector<int,_2>::y((Vector<int,_2> *)(canonizedCoords.m_data + 1));
      Vector<int,_3>::Vector(&local_84,iVar4,(size + -1) - *piVar5,size + -1);
      local_3c._0_4_ = local_84.m_data[0];
      local_3c._4_4_ = local_84.m_data[1];
      canonizedCoords.m_data[0] = local_84.m_data[2];
    }
    piVar5 = Vector<int,_3>::x((Vector<int,_3> *)local_3c);
    if (*piVar5 == -1) {
      piVar5 = Vector<int,_3>::z((Vector<int,_3> *)local_3c);
      iVar4 = *piVar5;
      piVar5 = Vector<int,_3>::y((Vector<int,_3> *)local_3c);
      Vector<int,_2>::Vector(&local_8c,iVar4,(size + -1) - *piVar5);
      CubeFaceCoords<int>::CubeFaceCoords
                ((CubeFaceCoords<int> *)((long)&origCoords_local + 4),CUBEFACE_NEGATIVE_X,&local_8c)
      ;
    }
    else {
      piVar5 = Vector<int,_3>::x((Vector<int,_3> *)local_3c);
      if (*piVar5 == size) {
        piVar5 = Vector<int,_3>::z((Vector<int,_3> *)local_3c);
        iVar4 = *piVar5;
        piVar5 = Vector<int,_3>::y((Vector<int,_3> *)local_3c);
        Vector<int,_2>::Vector(&local_94,(size + -1) - iVar4,(size + -1) - *piVar5);
        CubeFaceCoords<int>::CubeFaceCoords
                  ((CubeFaceCoords<int> *)((long)&origCoords_local + 4),CUBEFACE_POSITIVE_X,
                   &local_94);
      }
      else {
        piVar5 = Vector<int,_3>::y((Vector<int,_3> *)local_3c);
        if (*piVar5 == -1) {
          piVar5 = Vector<int,_3>::x((Vector<int,_3> *)local_3c);
          iVar4 = *piVar5;
          piVar5 = Vector<int,_3>::z((Vector<int,_3> *)local_3c);
          Vector<int,_2>::Vector(&local_9c,iVar4,(size + -1) - *piVar5);
          CubeFaceCoords<int>::CubeFaceCoords
                    ((CubeFaceCoords<int> *)((long)&origCoords_local + 4),CUBEFACE_NEGATIVE_Y,
                     &local_9c);
        }
        else {
          piVar5 = Vector<int,_3>::y((Vector<int,_3> *)local_3c);
          if (*piVar5 == size) {
            piVar5 = Vector<int,_3>::x((Vector<int,_3> *)local_3c);
            iVar4 = *piVar5;
            piVar5 = Vector<int,_3>::z((Vector<int,_3> *)local_3c);
            Vector<int,_2>::Vector(&local_a4,iVar4,*piVar5);
            CubeFaceCoords<int>::CubeFaceCoords
                      ((CubeFaceCoords<int> *)((long)&origCoords_local + 4),CUBEFACE_POSITIVE_Y,
                       &local_a4);
          }
          else {
            piVar5 = Vector<int,_3>::z((Vector<int,_3> *)local_3c);
            if (*piVar5 == -1) {
              piVar5 = Vector<int,_3>::x((Vector<int,_3> *)local_3c);
              iVar4 = *piVar5;
              piVar5 = Vector<int,_3>::y((Vector<int,_3> *)local_3c);
              Vector<int,_2>::Vector(&local_ac,(size + -1) - iVar4,(size + -1) - *piVar5);
              CubeFaceCoords<int>::CubeFaceCoords
                        ((CubeFaceCoords<int> *)((long)&origCoords_local + 4),CUBEFACE_NEGATIVE_Z,
                         &local_ac);
            }
            else {
              piVar5 = Vector<int,_3>::z((Vector<int,_3> *)local_3c);
              if (*piVar5 == size) {
                piVar5 = Vector<int,_3>::x((Vector<int,_3> *)local_3c);
                iVar4 = *piVar5;
                piVar5 = Vector<int,_3>::y((Vector<int,_3> *)local_3c);
                Vector<int,_2>::Vector(&local_b4,iVar4,(size + -1) - *piVar5);
                CubeFaceCoords<int>::CubeFaceCoords
                          ((CubeFaceCoords<int> *)((long)&origCoords_local + 4),CUBEFACE_POSITIVE_Z,
                           &local_b4);
              }
              else {
                Vector<int,_2>::Vector(&local_bc,-1);
                CubeFaceCoords<int>::CubeFaceCoords
                          ((CubeFaceCoords<int> *)((long)&origCoords_local + 4),CUBEFACE_LAST,
                           &local_bc);
              }
            }
          }
        }
      }
    }
  }
  else {
    CubeFaceCoords<int>::CubeFaceCoords
              ((CubeFaceCoords<int> *)((long)&origCoords_local + 4),CUBEFACE_LAST,-1,-1);
  }
  CVar1.t = local_c;
  CVar1.face = origCoords_local._4_4_;
  CVar1.s = uStack_10;
  return CVar1;
}

Assistant:

CubeFaceIntCoords remapCubeEdgeCoords (const CubeFaceIntCoords& origCoords, int size)
{
	bool uInBounds = de::inBounds(origCoords.s, 0, size);
	bool vInBounds = de::inBounds(origCoords.t, 0, size);

	if (uInBounds && vInBounds)
		return origCoords;

	if (!uInBounds && !vInBounds)
		return CubeFaceIntCoords(CUBEFACE_LAST, -1, -1);

	IVec2 coords(wrap(Sampler::CLAMP_TO_BORDER, origCoords.s, size),
				 wrap(Sampler::CLAMP_TO_BORDER, origCoords.t, size));
	IVec3 canonizedCoords;

	// Map the uv coordinates to canonized 3d coordinates.

	switch (origCoords.face)
	{
		case CUBEFACE_NEGATIVE_X: canonizedCoords = IVec3(0,					size-1-coords.y(),	coords.x());			break;
		case CUBEFACE_POSITIVE_X: canonizedCoords = IVec3(size-1,				size-1-coords.y(),	size-1-coords.x());		break;
		case CUBEFACE_NEGATIVE_Y: canonizedCoords = IVec3(coords.x(),			0,					size-1-coords.y());		break;
		case CUBEFACE_POSITIVE_Y: canonizedCoords = IVec3(coords.x(),			size-1,				coords.y());			break;
		case CUBEFACE_NEGATIVE_Z: canonizedCoords = IVec3(size-1-coords.x(),	size-1-coords.y(),	0);						break;
		case CUBEFACE_POSITIVE_Z: canonizedCoords = IVec3(coords.x(),			size-1-coords.y(),	size-1);				break;
		default: DE_ASSERT(false);
	}

	// Find an appropriate face to re-map the coordinates to.

	if (canonizedCoords.x() == -1)
		return CubeFaceIntCoords(CUBEFACE_NEGATIVE_X, IVec2(canonizedCoords.z(), size-1-canonizedCoords.y()));

	if (canonizedCoords.x() == size)
		return CubeFaceIntCoords(CUBEFACE_POSITIVE_X, IVec2(size-1-canonizedCoords.z(), size-1-canonizedCoords.y()));

	if (canonizedCoords.y() == -1)
		return CubeFaceIntCoords(CUBEFACE_NEGATIVE_Y, IVec2(canonizedCoords.x(), size-1-canonizedCoords.z()));

	if (canonizedCoords.y() == size)
		return CubeFaceIntCoords(CUBEFACE_POSITIVE_Y, IVec2(canonizedCoords.x(), canonizedCoords.z()));

	if (canonizedCoords.z() == -1)
		return CubeFaceIntCoords(CUBEFACE_NEGATIVE_Z, IVec2(size-1-canonizedCoords.x(), size-1-canonizedCoords.y()));

	if (canonizedCoords.z() == size)
		return CubeFaceIntCoords(CUBEFACE_POSITIVE_Z, IVec2(canonizedCoords.x(), size-1-canonizedCoords.y()));

	DE_ASSERT(false);
	return CubeFaceIntCoords(CUBEFACE_LAST, IVec2(-1));
}